

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v8::vprint(FILE *f,string_view format_str,format_args args)

{
  string_view text;
  char *s;
  size_t count;
  size_t in_RDI;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffd48;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  basic_string_view<char> local_290;
  locale_ref local_280 [7];
  allocator<char> local_241 [169];
  buffer<char> *in_stack_fffffffffffffe68;
  locale_ref in_stack_fffffffffffffe70;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>
  in_stack_fffffffffffffe78;
  basic_string_view<char> in_stack_fffffffffffffe88;
  
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator(local_241);
  detail::locale_ref::locale_ref(local_280);
  detail::vformat_to<char>
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe88,in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70);
  this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(local_241 + 1);
  s = detail::buffer<char>::data((buffer<char> *)this);
  count = detail::buffer<char>::size(&this->super_buffer<char>);
  basic_string_view<char>::basic_string_view(&local_290,s,count);
  text.size_ = in_RDI;
  text.data_ = s;
  detail::print((FILE *)this,text);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::print(f, {buffer.data(), buffer.size()});
}